

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

PacketList * __thiscall
ASDCP::MXF::Partition::PacketList::GetMDObjectsByType
          (PacketList *this,byte_t *ObjectID,
          list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
          *ObjectList)

{
  byte_t *pbVar1;
  char cVar2;
  _List_node_base *p_Var3;
  long *in_RCX;
  undefined1 *puVar4;
  
  if (ObjectList ==
      (list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> *)0x0
     ) {
    puVar4 = Kumu::RESULT_PTR;
  }
  else {
    for (pbVar1 = *(byte_t **)ObjectID; pbVar1 != ObjectID; pbVar1 = *(byte_t **)pbVar1) {
      cVar2 = (**(code **)(**(long **)(pbVar1 + 0x10) + 0x20))(*(long **)(pbVar1 + 0x10),ObjectList)
      ;
      if (cVar2 != '\0') {
        p_Var3 = (_List_node_base *)operator_new(0x18);
        p_Var3[1]._M_next = *(_List_node_base **)(pbVar1 + 0x10);
        std::__detail::_List_node_base::_M_hook(p_Var3);
        in_RCX[2] = in_RCX[2] + 1;
      }
    }
    puVar4 = (undefined1 *)&Kumu::RESULT_OK;
    if ((long *)*in_RCX == in_RCX) {
      puVar4 = Kumu::RESULT_FAIL;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar4);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Partition::PacketList::GetMDObjectsByType(const byte_t* ObjectID, std::list<InterchangeObject*>& ObjectList)
{
  ASDCP_TEST_NULL(ObjectID);
  std::list<InterchangeObject*>::iterator li;

  for ( li = m_List.begin(); li != m_List.end(); li++ )
    {
      if ( (*li)->HasUL(ObjectID) )
	ObjectList.push_back(*li);
    }

  return ObjectList.empty() ? RESULT_FAIL : RESULT_OK;
}